

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::PathDeclarationSyntax::PathDeclarationSyntax
          (PathDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,PathDescriptionSyntax *desc
          ,Token equals,Token openParen,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *delays
          ,Token closeParen,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  ExpressionSyntax *pEVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  iterator_base<slang::syntax::ExpressionSyntax_*> local_38;
  
  uVar5 = equals._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,PathDeclaration,attributes);
  (this->desc).ptr = desc;
  (this->equals).kind = (short)uVar5;
  (this->equals).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->equals).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->equals).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->equals).info = equals.info;
  (this->openParen).kind = openParen.kind;
  (this->openParen).field_0x2 = openParen._2_1_;
  (this->openParen).numFlags = (NumericTokenFlags)openParen.numFlags.raw;
  (this->openParen).rawLen = openParen.rawLen;
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(delays->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (delays->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->delays).super_SyntaxListBase.super_SyntaxNode.kind =
       (delays->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->delays).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->delays).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->delays).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (delays->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->delays).super_SyntaxListBase.childCount = (delays->super_SyntaxListBase).childCount;
  (this->delays).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e82a0;
  sVar1 = (delays->elements)._M_extent._M_extent_value;
  (this->delays).elements._M_ptr = (delays->elements)._M_ptr;
  (this->delays).elements._M_extent._M_extent_value = sVar1;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (desc->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->delays).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_38.index = 0;
  sVar1 = (this->delays).elements._M_extent._M_extent_value;
  local_38.list = &this->delays;
  for (; (local_38.list != &this->delays || (local_38.index != sVar1 + 1 >> 1));
      local_38.index = local_38.index + 1) {
    pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::dereference(&local_38);
    (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

PathDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, PathDescriptionSyntax& desc, Token equals, Token openParen, const SeparatedSyntaxList<ExpressionSyntax>& delays, Token closeParen, Token semi) :
        MemberSyntax(SyntaxKind::PathDeclaration, attributes), desc(&desc), equals(equals), openParen(openParen), delays(delays), closeParen(closeParen), semi(semi) {
        this->desc->parent = this;
        this->delays.parent = this;
        for (auto child : this->delays)
            child->parent = this;
    }